

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O0

int jsonp_strtod(strbuffer_t *strbuffer,double *out)

{
  int *piVar1;
  char *local_30;
  char *end;
  double value;
  double *out_local;
  strbuffer_t *strbuffer_local;
  
  value = (double)out;
  out_local = (double *)strbuffer;
  to_locale(strbuffer);
  piVar1 = __errno_location();
  *piVar1 = 0;
  end = (char *)strtod((char *)*out_local,&local_30);
  if (local_30 == (char *)((long)*out_local + (long)out_local[1])) {
    if (((((double)end != INFINITY) || (NAN((double)end))) &&
        (((double)end != -INFINITY || (NAN((double)end))))) ||
       (piVar1 = __errno_location(), *piVar1 != 0x22)) {
      *(char **)value = end;
      strbuffer_local._4_4_ = 0;
    }
    else {
      strbuffer_local._4_4_ = -1;
    }
    return strbuffer_local._4_4_;
  }
  __assert_fail("end == strbuffer->value + strbuffer->length",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/strconv.c"
                ,0x46,"int jsonp_strtod(strbuffer_t *, double *)");
}

Assistant:

int jsonp_strtod(strbuffer_t *strbuffer, double *out) {
    double value;
    char *end;

#if JSON_HAVE_LOCALECONV
    to_locale(strbuffer);
#endif

    errno = 0;
    value = strtod(strbuffer->value, &end);
    assert(end == strbuffer->value + strbuffer->length);

    if ((value == HUGE_VAL || value == -HUGE_VAL) && errno == ERANGE) {
        /* Overflow */
        return -1;
    }

    *out = value;
    return 0;
}